

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

bool __thiscall
Inferences::InductionClauseIterator::isValidBound
          (InductionClauseIterator *this,InductionContext *context,Bound *bound)

{
  anon_class_16_2_e1674ede fs_1;
  anon_class_16_2_e1674ede fs;
  bool bVar1;
  ResultOf<TL::Get<0,_TL::List<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:1742:13),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:1744:13)>_>,_const_TL::Get<0,_Ts>_&>
  RVar2;
  reference pvVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  Term *this_00;
  long in_RSI;
  Term *otherArg;
  Literal **lit;
  Literal **__end2;
  Literal **__begin2;
  Stack<Kernel::Literal_*> *__range2;
  value_type *kv;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range1;
  Term *pt;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *in_stack_ffffffffffffff68;
  _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
  *in_stack_ffffffffffffff70;
  Term *in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff88;
  value_type *pvVar6;
  anon_union_8_2_f154dc0f_for_Term_10 this_01;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_38;
  long local_30;
  Term *local_28;
  long local_18;
  
  local_18 = in_RSI;
  local_28 = getPlaceholderForTerm
                       ((vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)this,
                        context._4_4_);
  local_30 = local_18 + 0x18;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  do {
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return true;
    }
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
             ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                          *)0x7cde91);
    this_01 = (anon_union_8_2_f154dc0f_for_Term_10)&pvVar3->second;
    pvVar4 = (value_type *)Lib::Stack<Kernel::Literal_*>::begin((Stack<Kernel::Literal_*> *)this_01)
    ;
    pvVar5 = (value_type *)Lib::Stack<Kernel::Literal_*>::end((Stack<Kernel::Literal_*> *)this_01);
    while (pvVar4 != pvVar5) {
      pvVar6 = pvVar4;
      this_00 = InductionHelper::getOtherTermFromComparison
                          ((Literal *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff80 = (Term *)&stack0xffffffffffffff90;
      in_stack_ffffffffffffff70 =
           (_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
            *)&stack0xffffffffffffff90;
      fs.kv = (value_type *)this_01;
      fs.otherArg = (Term **)pvVar6;
      fs_1.kv = pvVar5;
      fs_1.otherArg = (Term **)pvVar4;
      in_stack_ffffffffffffff88 = pvVar3;
      RVar2 = Lib::
              Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>
              ::
              match<Inferences::InductionClauseIterator::isValidBound(Inferences::InductionContext_const&,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>const&)::__0,Inferences::InductionClauseIterator::isValidBound(Inferences::InductionContext_const&,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>const&)::__1>
                        ((Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
                          *)this_00,fs,fs_1);
      if (!RVar2) {
        return false;
      }
      pvVar4 = (value_type *)&pvVar6->second;
    }
    std::__detail::
    _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
    ::operator++(in_stack_ffffffffffffff70);
  } while( true );
}

Assistant:

bool InductionClauseIterator::isValidBound(const InductionContext& context, const Bound& bound)
{
  ASS_EQ(context._indTerms.size(), 1);
  Term* pt = getPlaceholderForTerm(context._indTerms,0);
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      ASS((lit != nullptr) && (kv.first != nullptr));
      Term* otherArg = InductionHelper::getOtherTermFromComparison(lit, pt);
      if (!bound.match(
            [&](TermLiteralClause const&  bound) 
            { return InductionHelper::isValidBound(otherArg, kv.first, bound); },
            [&](DefaultBound const& bound) 
            { return InductionHelper::isValidForDefaultBound(otherArg, kv.first, bound.term); }
            )) {
        return false;
      }
    }
  }
  return true;
}